

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

double __thiscall smf::MidiFile::linearSecondInterpolationAtTick(MidiFile *this,int ticktime)

{
  int iVar1;
  pointer p_Var2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  pointer p_Var7;
  double dVar8;
  
  if ((this->m_timemapvalid == false) && (buildTimeMap(this), this->m_timemapvalid == false)) {
    dVar8 = -1.0;
  }
  else {
    dVar8 = -1.0;
    if ((-1 < ticktime) &&
       (p_Var7 = (this->m_timemap).
                 super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
                 super__Vector_impl_data._M_finish, ticktime <= p_Var7[-1].tick)) {
      p_Var2 = (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (long)p_Var7 - (long)p_Var2 >> 4;
      if ((double)p_Var7[-1].tick * 0.5 <= (double)ticktime) {
        p_Var7 = p_Var2 + (uVar3 & 0xffffffff);
        uVar6 = uVar3 & 0xffffffff;
        do {
          p_Var7 = p_Var7 + -1;
          if ((int)uVar6 < 2) {
            return -1.0;
          }
          uVar4 = (int)uVar6 - 1;
          uVar6 = (ulong)uVar4;
        } while (ticktime < p_Var7->tick);
LAB_0011d3b7:
        if ((int)uVar4 < (int)uVar3 + -1) {
          if (p_Var2[uVar4].tick == ticktime) {
            dVar8 = p_Var2[uVar4].seconds;
          }
          else {
            dVar8 = (double)p_Var2[uVar4].tick;
            dVar8 = ((p_Var2[(long)(int)uVar4 + 1].seconds - p_Var2[uVar4].seconds) /
                    ((double)p_Var2[(long)(int)uVar4 + 1].tick - dVar8)) *
                    ((double)ticktime - dVar8) + p_Var2[uVar4].seconds;
          }
        }
      }
      else {
        lVar5 = 0;
        uVar6 = 0;
        p_Var7 = p_Var2;
        if (0 < (int)uVar3) {
          uVar6 = uVar3 & 0xffffffff;
        }
        for (; -lVar5 != uVar6; lVar5 = lVar5 + -1) {
          iVar1 = p_Var7->tick;
          if (iVar1 != ticktime && ticktime <= iVar1) {
            if (lVar5 == 0) {
              return -1.0;
            }
            uVar4 = ~(uint)lVar5;
            goto LAB_0011d3b7;
          }
          if (iVar1 == ticktime) {
            uVar4 = -(uint)lVar5;
            goto LAB_0011d3b7;
          }
          p_Var7 = p_Var7 + 1;
        }
      }
    }
  }
  return dVar8;
}

Assistant:

double MidiFile::linearSecondInterpolationAtTick(int ticktime) {
	if (m_timemapvalid == 0) {
		buildTimeMap();
		if (m_timemapvalid == 0) {
			return -1.0;    // something went wrong
		}
	}

	int i;
	double lasttick = m_timemap[m_timemap.size()-1].tick;
	// give an error value of -1 if time is out of range of data.
	if (ticktime < 0.0) {
		return -1;
	}
	if (ticktime > m_timemap.back().tick) {
		return -1;  // don't try to extrapolate
	}

	// Guess which side of the list is closest to target:
	// Could do a more efficient algorithm since time values are sorted,
	// but good enough for now...
	int startindex = -1;
	if (ticktime < lasttick / 2) {
		for (i=0; i<(int)m_timemap.size(); i++) {
			if (m_timemap[i].tick > ticktime) {
				startindex = i-1;
				break;
			} else if (m_timemap[i].tick == ticktime) {
				startindex = i;
				break;
			}
		}
	} else {
		for (i=(int)m_timemap.size()-1; i>0; i--) {
			if (m_timemap[i].tick < ticktime) {
				startindex = i;
				break;
			} else if (m_timemap[i].tick == ticktime) {
				startindex = i;
				break;
			}
		}
	}

	if (startindex < 0) {
		return -1;
	}
	if (startindex >= (int)m_timemap.size()-1) {
		return -1;
	}

	if (m_timemap[startindex].tick == ticktime) {
		return m_timemap[startindex].seconds;
	}

	double x1 = m_timemap[startindex].tick;
	double x2 = m_timemap[startindex+1].tick;
	double y1 = m_timemap[startindex].seconds;
	double y2 = m_timemap[startindex+1].seconds;
	double xi = ticktime;

	return (xi-x1) * ((y2-y1)/(x2-x1)) + y1;
}